

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::filterMember
          (TGlslangToSpvTraverser *this,TType *member)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  bool bVar2;
  EShLanguage EVar3;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar4;
  bool local_1d2;
  bool local_1c2;
  bool local_1b2;
  bool local_1a2;
  bool local_192;
  bool local_179;
  _Self local_178;
  byte local_16b;
  byte local_16a;
  allocator<char> local_169;
  key_type local_168;
  _Self local_148;
  _Self local_140;
  byte local_133;
  byte local_132;
  allocator<char> local_131;
  key_type local_130;
  _Self local_110;
  _Self local_108;
  byte local_fb;
  byte local_fa;
  allocator<char> local_f9;
  key_type local_f8;
  _Self local_d8;
  _Self local_d0;
  byte local_c3;
  byte local_c2;
  allocator<char> local_c1;
  key_type local_c0;
  _Self local_a0;
  _Self local_98;
  byte local_8b;
  byte local_8a;
  allocator<char> local_89;
  key_type local_88;
  _Self local_68;
  _Self local_60;
  byte local_53;
  byte local_52;
  allocator<char> local_51;
  key_type local_50;
  _Self local_30;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extensions;
  TType *member_local;
  TGlslangToSpvTraverser *this_local;
  
  extensions = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)member;
  member_local = (TType *)this;
  local_28 = glslang::TIntermediate::getRequestedExtensions_abi_cxx11_(this->glslangIntermediate);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
           (**(code **)(*(long *)&(extensions->_M_t)._M_impl + 0x30))();
  bVar2 = std::operator==(pbVar4,"gl_SecondaryViewportMaskNV");
  psVar1 = local_28;
  local_52 = 0;
  local_53 = 0;
  local_179 = false;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_52 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"GL_NV_stereo_view_rendering",&local_51);
    local_53 = 1;
    local_30._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(psVar1,&local_50);
    local_60._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(local_28);
    local_179 = std::operator==(&local_30,&local_60);
  }
  if ((local_53 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator(&local_51);
  }
  if (local_179 == false) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             (**(code **)(*(long *)&(extensions->_M_t)._M_impl + 0x30))();
    bVar2 = std::operator==(pbVar4,"gl_SecondaryPositionNV");
    psVar1 = local_28;
    local_8a = 0;
    local_8b = 0;
    local_192 = false;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_8a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"GL_NV_stereo_view_rendering",&local_89);
      local_8b = 1;
      local_68._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(psVar1,&local_88);
      local_98._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(local_28);
      local_192 = std::operator==(&local_68,&local_98);
    }
    if ((local_8b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_88);
    }
    if ((local_8a & 1) != 0) {
      std::allocator<char>::~allocator(&local_89);
    }
    if (local_192 == false) {
      EVar3 = glslang::TIntermediate::getStage(this->glslangIntermediate);
      if (EVar3 == EShLangMesh) {
        pbVar4 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (**(code **)(*(long *)&(extensions->_M_t)._M_impl + 0x30))();
        bVar2 = std::operator==(pbVar4,"gl_PrimitiveShadingRateEXT");
        psVar1 = local_28;
        local_c2 = 0;
        local_c3 = 0;
        local_1a2 = false;
        if (bVar2) {
          std::allocator<char>::allocator();
          local_c2 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"GL_EXT_fragment_shading_rate",&local_c1);
          local_c3 = 1;
          local_a0._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(psVar1,&local_c0);
          local_d0._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(local_28);
          local_1a2 = std::operator==(&local_a0,&local_d0);
        }
        if ((local_c3 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_c0);
        }
        if ((local_c2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_c1);
        }
        if (local_1a2 != false) {
          return true;
        }
      }
      EVar3 = glslang::TIntermediate::getStage(this->glslangIntermediate);
      if (EVar3 != EShLangMesh) {
        pbVar4 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (**(code **)(*(long *)&(extensions->_M_t)._M_impl + 0x30))();
        bVar2 = std::operator==(pbVar4,"gl_ViewportMask");
        psVar1 = local_28;
        local_fa = 0;
        local_fb = 0;
        local_1b2 = false;
        if (bVar2) {
          std::allocator<char>::allocator();
          local_fa = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,"GL_NV_viewport_array2",&local_f9);
          local_fb = 1;
          local_d8._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(psVar1,&local_f8);
          local_108._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(local_28);
          local_1b2 = std::operator==(&local_d8,&local_108);
        }
        if ((local_fb & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_f8);
        }
        if ((local_fa & 1) != 0) {
          std::allocator<char>::~allocator(&local_f9);
        }
        if (local_1b2 != false) {
          return true;
        }
        pbVar4 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (**(code **)(*(long *)&(extensions->_M_t)._M_impl + 0x30))();
        bVar2 = std::operator==(pbVar4,"gl_PositionPerViewNV");
        psVar1 = local_28;
        local_132 = 0;
        local_133 = 0;
        local_1c2 = false;
        if (bVar2) {
          std::allocator<char>::allocator();
          local_132 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130,"GL_NVX_multiview_per_view_attributes",&local_131);
          local_133 = 1;
          local_110._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(psVar1,&local_130);
          local_140._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(local_28);
          local_1c2 = std::operator==(&local_110,&local_140);
        }
        if ((local_133 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_130);
        }
        if ((local_132 & 1) != 0) {
          std::allocator<char>::~allocator(&local_131);
        }
        if (local_1c2 != false) {
          return true;
        }
        pbVar4 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (**(code **)(*(long *)&(extensions->_M_t)._M_impl + 0x30))();
        bVar2 = std::operator==(pbVar4,"gl_ViewportMaskPerViewNV");
        psVar1 = local_28;
        local_16a = 0;
        local_16b = 0;
        local_1d2 = false;
        if (bVar2) {
          std::allocator<char>::allocator();
          local_16a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_168,"GL_NVX_multiview_per_view_attributes",&local_169);
          local_16b = 1;
          local_148._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(psVar1,&local_168);
          local_178._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(local_28);
          local_1d2 = std::operator==(&local_148,&local_178);
        }
        if ((local_16b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_168);
        }
        if ((local_16a & 1) != 0) {
          std::allocator<char>::~allocator(&local_169);
        }
        if (local_1d2 != false) {
          return true;
        }
      }
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TGlslangToSpvTraverser::filterMember(const glslang::TType& member)
{
    auto& extensions = glslangIntermediate->getRequestedExtensions();

    if (member.getFieldName() == "gl_SecondaryViewportMaskNV" &&
        extensions.find("GL_NV_stereo_view_rendering") == extensions.end())
        return true;
    if (member.getFieldName() == "gl_SecondaryPositionNV" &&
        extensions.find("GL_NV_stereo_view_rendering") == extensions.end())
        return true;

    if (glslangIntermediate->getStage() == EShLangMesh) {
        if (member.getFieldName() == "gl_PrimitiveShadingRateEXT" &&
            extensions.find("GL_EXT_fragment_shading_rate") == extensions.end())
            return true;
    }

    if (glslangIntermediate->getStage() != EShLangMesh) {
        if (member.getFieldName() == "gl_ViewportMask" &&
            extensions.find("GL_NV_viewport_array2") == extensions.end())
            return true;
        if (member.getFieldName() == "gl_PositionPerViewNV" &&
            extensions.find("GL_NVX_multiview_per_view_attributes") == extensions.end())
            return true;
        if (member.getFieldName() == "gl_ViewportMaskPerViewNV" &&
            extensions.find("GL_NVX_multiview_per_view_attributes") == extensions.end())
            return true;
    }

    return false;
}